

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_is_hdr_from_memory(stbi_uc *buffer,int len)

{
  int iVar1;
  stbi__context s;
  stbi__context sStack_d8;
  
  sStack_d8.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  sStack_d8.read_from_callbacks = 0;
  sStack_d8.img_buffer_end = buffer + len;
  sStack_d8.img_buffer = buffer;
  sStack_d8.img_buffer_original = buffer;
  sStack_d8.img_buffer_original_end = sStack_d8.img_buffer_end;
  iVar1 = stbi__hdr_test(&sStack_d8);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_hdr_from_memory(stbi_uc const *buffer, int len)
{
#ifndef STBI_NO_HDR
    stbi__context s;
    stbi__start_mem(&s, buffer, len);
    return stbi__hdr_test(&s);
#else
                                                                                                                            STBI_NOTUSED(buffer);
   STBI_NOTUSED(len);
   return 0;
#endif
}